

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateExtension
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  Printer *this_00;
  bool bVar3;
  Type TVar4;
  long *plVar5;
  FieldDescriptor *pFVar6;
  string *value1;
  size_type *psVar7;
  FileDescriptor *pFVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar9;
  int i;
  int i_00;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *pGVar10;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  GeneratorOptions *options_03;
  GeneratorOptions *options_04;
  char *pcVar11;
  Descriptor *pDVar12;
  BytesMode bytes_mode;
  string local_1a8;
  string local_188;
  GeneratorOptions *local_168;
  string local_160;
  string local_140;
  Printer *local_120;
  int local_118;
  int local_114;
  string local_110;
  string local_f0;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string extension_scope;
  string local_90;
  string local_70;
  string local_50;
  
  pFVar6 = field;
  if (*(GeneratorOptions **)(field + 0x68) == (GeneratorOptions *)0x0) {
    (anonymous_namespace)::GetFilePath_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x30),(FileDescriptor *)field);
    pGVar10 = extraout_RDX_00;
  }
  else {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&extension_scope,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x68),(Descriptor *)field);
    pGVar10 = extraout_RDX;
  }
  bytes_mode = 0x221dd4;
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)field,pGVar10,pFVar6);
  (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
            (&local_188,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,true,false,false,bytes_mode);
  value1 = &local_1a8;
  io::Printer::Print(printer,
                     "\n/**\n * A tuple of {field number, class constructor} for the extension\n * field named `$name$`.\n * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n */\n$class$.$name$ = new jspb.ExtensionFieldInfo(\n"
                     ,"name",value1,"class",&extension_scope,"extensionType",&local_188);
  iVar9 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    iVar9 = extraout_EDX_01;
  }
  SimpleItoa_abi_cxx11_(&local_1a8,(protobuf *)(ulong)*(uint *)(field + 0x38),iVar9);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_188,(_anonymous_namespace_ *)field,options_00,(FieldDescriptor *)value1);
  TVar4 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_160,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)value1);
  }
  else {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"null","");
  }
  local_168 = options;
  TVar4 = FieldDescriptor::type(field);
  iVar9 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
  if (iVar9 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)local_168,(GeneratorOptions *)field,
               (FieldDescriptor *)value1);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140.field_2._8_8_ = plVar5[3];
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar7;
      local_140._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_140._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"null","");
  }
  pcVar11 = ", 0";
  if (*(int *)(field + 0x4c) == 3) {
    pcVar11 = ", 1";
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  pcVar2 = ", 0";
  if (*(int *)(field + 0x4c) == 3) {
    pcVar2 = ", 1";
  }
  local_120 = printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar11 + 2,pcVar2 + 3);
  pDVar12 = (Descriptor *)0x361427;
  io::Printer::Print(local_120,
                     "    $index$,\n    {$name$: 0},\n    $ctor$,\n     /** @type {?function((boolean|undefined),!jspb.Message=): !Object} */ (\n         $toObject$),\n    $repeated$);\n"
                     ,"index",&local_1a8,"name",&local_188,"ctor",&local_160,"toObject",&local_140,
                     "repeated",&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  pGVar10 = local_168;
  if ((iVar9 == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pFVar8 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)pGVar10,*(GeneratorOptions **)(field + 0x30),pFVar8
             ,pDVar12);
  SimpleItoa_abi_cxx11_(&local_188,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)field,options_01,(FieldDescriptor *)pFVar8);
  (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
            (&local_140,(_anonymous_namespace_ *)field,options_02,(FieldDescriptor *)pFVar8);
  (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
            (&local_110,(_anonymous_namespace_ *)field,options_03,(FieldDescriptor *)pFVar8);
  TVar4 = FieldDescriptor::type(field);
  local_114 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
  if (local_114 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)pGVar10,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d0._0_8_ = local_d0 + 0x10;
    pFVar8 = (FileDescriptor *)(plVar5 + 2);
    if ((FieldDescriptor *)*plVar5 == (FieldDescriptor *)pFVar8) {
      local_c0._M_allocated_capacity = *(undefined8 *)pFVar8;
      local_c0._8_8_ = plVar5[3];
    }
    else {
      local_c0._M_allocated_capacity = *(undefined8 *)pFVar8;
      local_d0._0_8_ = (FieldDescriptor *)*plVar5;
    }
    local_d0._8_8_ = plVar5[1];
    *plVar5 = (long)pFVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"undefined","");
  }
  TVar4 = FieldDescriptor::type(field);
  local_118 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
  if (local_118 == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&local_90,(_anonymous_namespace_ *)local_168,(GeneratorOptions *)field,
               (FieldDescriptor *)pFVar8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar7;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"undefined","");
  }
  pDVar12 = (Descriptor *)0x36667a;
  io::Printer::Print(local_120,
                     "\n$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n    $class$.$name$,\n    $binaryReaderFn$,\n    $binaryWriterFn$,\n    $binaryMessageSerializeFn$,\n    $binaryMessageDeserializeFn$,\n"
                     ,"extendName",&local_1a8,"index",&local_188,"class",&extension_scope,"name",
                     &local_160,"binaryReaderFn",&local_140,"binaryWriterFn",&local_110,
                     "binaryMessageSerializeFn",(string *)local_d0,"binaryMessageDeserializeFn",
                     &local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  this_00 = local_120;
  paVar1 = &local_1a8.field_2;
  if ((local_118 == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
  }
  if ((local_114 == 10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = FieldDescriptor::is_packed(field);
  pcVar11 = "false";
  if (bVar3) {
    pcVar11 = "true";
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,pcVar11,pcVar11 + ((ulong)bVar3 ^ 5));
  io::Printer::Print(this_00,"    $isPacked$);\n","isPacked",&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  pFVar8 = *(FileDescriptor **)(field + 0x58);
  (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
            (&local_1a8,(_anonymous_namespace_ *)local_168,*(GeneratorOptions **)(field + 0x30),
             pFVar8,pDVar12);
  SimpleItoa_abi_cxx11_(&local_188,(protobuf *)(ulong)*(uint *)(field + 0x38),i_00);
  (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
            (&local_160,(_anonymous_namespace_ *)field,options_04,(FieldDescriptor *)pFVar8);
  io::Printer::Print(this_00,
                     "// This registers the extension field with the extended class, so that\n// toObject() will function correctly.\n$extendName$[$index$] = $class$.$name$;\n\n"
                     ,"extendName",&local_1a8,"index",&local_188,"class",&extension_scope,"name",
                     &local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)extension_scope._M_dataplus._M_p != &extension_scope.field_2) {
    operator_delete(extension_scope._M_dataplus._M_p,
                    extension_scope.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateExtension(const GeneratorOptions& options,
                                  io::Printer* printer,
                                  const FieldDescriptor* field) const {
  string extension_scope =
      (field->extension_scope()
           ? GetMessagePath(options, field->extension_scope())
           : GetFilePath(options, field->file()));

  printer->Print(
      "\n"
      "/**\n"
      " * A tuple of {field number, class constructor} for the extension\n"
      " * field named `$name$`.\n"
      " * @type {!jspb.ExtensionFieldInfo.<$extensionType$>}\n"
      " */\n"
      "$class$.$name$ = new jspb.ExtensionFieldInfo(\n",
      "name", JSObjectFieldName(options, field),
      "class", extension_scope,
      "extensionType", JSFieldTypeAnnotation(
          options, field,
          /* is_setter_argument = */ false,
          /* force_present = */ true,
          /* singular_if_not_packed = */ false));
  printer->Print(
      "    $index$,\n"
      "    {$name$: 0},\n"
      "    $ctor$,\n"
      "     /** @type {?function((boolean|undefined),!jspb.Message=): "
      "!Object} */ (\n"
      "         $toObject$),\n"
      "    $repeated$);\n",
      "index", SimpleItoa(field->number()),
      "name", JSObjectFieldName(options, field),
      "ctor", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
               SubmessageTypeRef(options, field) : string("null")),
      "toObject", (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ?
                   (SubmessageTypeRef(options, field) + ".toObject") :
                   string("null")),
      "repeated", (field->is_repeated() ? "1" : "0"));

  printer->Print(
      "\n"
      "$extendName$Binary[$index$] = new jspb.ExtensionFieldBinaryInfo(\n"
      "    $class$.$name$,\n"
      "    $binaryReaderFn$,\n"
      "    $binaryWriterFn$,\n"
      "    $binaryMessageSerializeFn$,\n"
      "    $binaryMessageDeserializeFn$,\n",
      "extendName",
      JSExtensionsObjectName(options, field->file(), field->containing_type()),
      "index", SimpleItoa(field->number()), "class", extension_scope, "name",
      JSObjectFieldName(options, field), "binaryReaderFn",
      JSBinaryReaderMethodName(options, field), "binaryWriterFn",
      JSBinaryWriterMethodName(options, field), "binaryMessageSerializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".serializeBinaryToWriter")
          : "undefined",
      "binaryMessageDeserializeFn",
      (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE)
          ? (SubmessageTypeRef(options, field) + ".deserializeBinaryFromReader")
          : "undefined");

  printer->Print("    $isPacked$);\n", "isPacked",
                 (field->is_packed() ? "true" : "false"));

  printer->Print(
      "// This registers the extension field with the extended class, so that\n"
      "// toObject() will function correctly.\n"
      "$extendName$[$index$] = $class$.$name$;\n"
      "\n",
      "extendName", JSExtensionsObjectName(options, field->file(),
                                           field->containing_type()),
      "index", SimpleItoa(field->number()),
      "class", extension_scope,
      "name", JSObjectFieldName(options, field));
}